

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O2

int Sdb_StoPrepareSet(Sdb_Sto_t *p,int iObj,int Index)

{
  Sdb_Cut_t *pCut;
  int iVar1;
  int *piVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  word wVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  
  pVVar4 = Vec_WecEntry(p->vCuts,iObj);
  piVar2 = pVVar4->pArray;
  piVar9 = piVar2 + 1;
  piVar8 = p->pCuts[(uint)Index][0].pLeaves;
  for (lVar7 = 0; iVar1 = *piVar2, lVar7 < iVar1; lVar7 = lVar7 + 1) {
    pCut = p->pCuts[(uint)Index] + lVar7;
    *(uint *)&p->pCuts[(uint)Index][lVar7].field_0x14 =
         *(uint *)&p->pCuts[(uint)Index][lVar7].field_0x14 & 0xfffffff | *piVar9 << 0x1c;
    lVar5 = 0;
    while( true ) {
      if ((long)*piVar9 < lVar5 + 1) break;
      piVar8[lVar5] = piVar9[lVar5 + 1];
      lVar5 = lVar5 + 1;
    }
    pCut->iFunc = piVar9[(long)*piVar9 + 1];
    wVar6 = Sdb_CutGetSign(pCut);
    pCut->Sign = wVar6;
    uVar3 = Sdb_CutTreeLeaves(p,pCut);
    *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xf0000000 | uVar3 & 0xfffffff;
    piVar9 = piVar9 + (long)*piVar9 + 2;
    piVar8 = piVar8 + 0xc;
  }
  return iVar1;
}

Assistant:

static inline int Sdb_StoPrepareSet( Sdb_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sdb_ForEachCut( pList, pCut, i )
    {
        Sdb_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sdb_CutGetSign( pCutTemp );
        pCutTemp->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutTemp );
    }
    return pList[0];
}